

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Matrix<float,_4,_3>_> *pVVar9;
  pointer pcVar10;
  double dVar11;
  undefined8 uVar12;
  pointer pMVar13;
  bool bVar14;
  int iVar15;
  _Rb_tree_node_base *p_Var16;
  Interval *pIVar17;
  IVal *pIVar18;
  MessageBuilder *pMVar19;
  undefined8 *puVar20;
  uint uVar21;
  Matrix<float,_4,_3> *pMVar22;
  undefined1 *puVar23;
  int row;
  long lVar24;
  FloatFormat *pFVar25;
  long lVar26;
  long lVar27;
  char *pcVar28;
  _Base_ptr p_Var29;
  _Base_ptr p_Var30;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  *pBVar31;
  IVal in2;
  IVal reference1;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal in0;
  FuncSet funcs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff9b8;
  undefined4 uStack_644;
  size_type local_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  *local_628;
  IVal local_619;
  TestLog *local_618;
  size_t local_610;
  ulong local_608;
  TestStatus *local_600;
  Matrix<float,_4,_3> *local_5f8;
  FloatFormat *local_5f0;
  long local_5e8;
  string local_5e0;
  Matrix<float,_4,_3> *local_5c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_5b8;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>
  local_588;
  FloatFormat local_558;
  pointer local_528;
  pointer local_520;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_518;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [368];
  undefined1 local_338 [16];
  undefined1 local_328 [24];
  double local_310;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar25 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_600 = __return_storage_ptr__;
  iVar15 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,4,3>,tcu::Matrix<float,4,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_518,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_4,_3>,_tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar25,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar15 + 0xdeadbeef),
             in_stack_fffffffffffff9b8);
  pMVar13 = local_518.in0.
            super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_610 = ((long)local_518.in0.
                     super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_518.in0.
                     super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_4,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_588,local_610);
  local_558.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_558.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_558.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_558.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_558.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_558.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_558.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_558.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_558._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_5b8._M_impl.super__Rb_tree_header._M_header;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_5b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_5b8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_618 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_518.in0.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_518.in1.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_518.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_518.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_528 = local_588.out0.
              super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_520 = local_588.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_4b8 + 8);
  local_628 = this;
  local_4b8._0_8_ = local_618;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_338 + 8);
  local_338._8_4_ = _S_red;
  local_328._0_8_ = (_Base_ptr)0x0;
  local_310 = 0.0;
  pSVar7 = (local_628->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_5f0 = pFVar25;
  local_328._8_8_ = p_Var4;
  local_328._16_8_ = p_Var4;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_338);
  if ((_Rb_tree_node_base *)local_328._8_8_ != p_Var4) {
    p_Var16 = (_Rb_tree_node_base *)local_328._8_8_;
    do {
      (**(code **)(**(long **)(p_Var16 + 1) + 0x30))(*(long **)(p_Var16 + 1),local_1a8);
      p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != p_Var4);
  }
  pFVar25 = local_5f0;
  if (local_310 != 0.0) {
    poVar3 = (ostringstream *)(local_4b8 + 8);
    local_4b8._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,(char *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),local_640);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8) != &local_638) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                      local_638._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pBVar31 = local_628;
  pSVar8 = (local_628->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pMVar22 = (Matrix<float,_4,_3> *)&local_528;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_610,&local_218,pMVar22,0);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_4b8);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_1a8);
  tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_338);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_5b8,
             (pBVar31->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_4b8);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_5b8,
             (pBVar31->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (pBVar31->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&stack0xfffffffffffff9b8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (pBVar31->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_5e0);
  Environment::bind<tcu::Matrix<float,4,3>>
            ((Environment *)&local_5b8,
             (pBVar31->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.m_ptr,
             (IVal *)local_338);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_5b8,
             (pBVar31->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_619);
  if (local_518.in0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar13) {
    local_608 = 0;
  }
  else {
    local_5c0 = (Matrix<float,_4,_3> *)(local_610 + (local_610 == 0));
    local_5f8 = (Matrix<float,_4,_3> *)0x0;
    local_608 = 0;
    do {
      tcu::Matrix<tcu::Interval,_4,_3>::Matrix((Matrix<tcu::Interval,_4,_3> *)local_1a8);
      local_5e8 = (long)local_5f8 * 0x30;
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_338,(shaderexecutor *)pFVar25,
                 (FloatFormat *)
                 (local_518.in0.
                  super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)local_5f8),pMVar22);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_4b8,pFVar25,(IVal *)local_338);
      pIVar17 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_5b8,
                           (pBVar31->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      lVar24 = 0;
      pMVar19 = (MessageBuilder *)local_4b8;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)((long)&pIVar17->m_hi + lVar26) =
               *(undefined8 *)(&pMVar19->field_0x10 + lVar26);
          puVar20 = (undefined8 *)((long)&pMVar19->m_log + lVar26);
          dVar11 = (double)puVar20[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar17->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar26;
          *(undefined8 *)pbVar2 = *puVar20;
          *(double *)(pbVar2 + 8) = dVar11;
          lVar26 = lVar26 + 0x60;
        } while (lVar26 != 0x120);
        lVar24 = lVar24 + 1;
        pIVar17 = pIVar17 + 1;
        pMVar19 = (MessageBuilder *)&pMVar19->field_0x18;
      } while (lVar24 != 4);
      round<tcu::Matrix<float,4,3>>
                ((IVal *)local_338,(shaderexecutor *)pFVar25,
                 (FloatFormat *)
                 ((long)((local_518.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                 local_5e8),(Matrix<float,_4,_3> *)pMVar19);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_4b8,pFVar25,(IVal *)local_338);
      pIVar17 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_5b8,
                           (pBVar31->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      lVar24 = local_5e8;
      lVar26 = 0;
      pMVar19 = (MessageBuilder *)local_4b8;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)((long)&pIVar17->m_hi + lVar27) =
               *(undefined8 *)(&pMVar19->field_0x10 + lVar27);
          puVar20 = (undefined8 *)((long)&pMVar19->m_log + lVar27);
          dVar11 = (double)puVar20[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)&pIVar17->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar27;
          *(undefined8 *)pbVar2 = *puVar20;
          *(double *)(pbVar2 + 8) = dVar11;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x120);
        lVar26 = lVar26 + 1;
        pIVar17 = pIVar17 + 1;
        pMVar19 = (MessageBuilder *)&pMVar19->field_0x18;
      } while (lVar26 != 4);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (pBVar31->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_5b8,
                 (pBVar31->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_4a8._24_4_ = (pBVar31->m_caseCtx).precision;
      local_4a8._16_8_ = pFVar25->m_maxValue;
      local_4b8._0_8_ = *(undefined8 *)pFVar25;
      local_4b8._8_4_ = pFVar25->m_fractionBits;
      local_4b8._12_4_ = pFVar25->m_hasSubnormal;
      local_4a8._0_4_ = pFVar25->m_hasInf;
      local_4a8._4_4_ = pFVar25->m_hasNaN;
      local_4a8[8] = pFVar25->m_exactPrecision;
      local_4a8._9_3_ = *(undefined3 *)&pFVar25->field_0x19;
      local_4a8._12_4_ = *(undefined4 *)&pFVar25->field_0x1c;
      local_4a8._40_4_ = 0;
      pSVar7 = (pBVar31->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_4a8._32_8_ = &local_5b8;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(MessageBuilder *)local_4b8);
      pIVar18 = Environment::lookup<tcu::Matrix<float,4,3>>
                          ((Environment *)&local_5b8,
                           (pBVar31->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_4,_3>,_tcu::Matrix<tcu::Interval,_4,_3>_>::doConvert
                ((IVal *)local_4b8,&local_558,pIVar18);
      puVar23 = local_1a8;
      lVar26 = 0;
      pMVar19 = (MessageBuilder *)local_4b8;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)(puVar23 + lVar27 + 0x10) = *(undefined8 *)(&pMVar19->field_0x10 + lVar27);
          puVar20 = (undefined8 *)((long)&pMVar19->m_log + lVar27);
          uVar12 = puVar20[1];
          *(undefined8 *)(puVar23 + lVar27) = *puVar20;
          *(undefined8 *)((long)(puVar23 + lVar27) + 8) = uVar12;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 != 0x120);
        lVar26 = lVar26 + 1;
        puVar23 = puVar23 + 0x18;
        pMVar19 = (MessageBuilder *)&pMVar19->field_0x18;
      } while (lVar26 != 4);
      poVar3 = (ostringstream *)(local_4b8 + 8);
      bVar14 = contains<tcu::Matrix<float,4,3>>
                         ((IVal *)local_1a8,
                          (Matrix<float,_4,_3> *)
                          ((long)((local_588.out0.
                                   super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].
                                 m_data + lVar24));
      local_4b8._0_8_ = local_4a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b8,"Shader output 0 is outside acceptable range","");
      bVar14 = tcu::ResultCollector::check(&local_1f8,bVar14,(string *)local_4b8);
      if ((TestLog *)local_4b8._0_8_ != (TestLog *)local_4a8) {
        operator_delete((void *)local_4b8._0_8_,CONCAT44(local_4a8._4_4_,local_4a8._0_4_) + 1);
      }
      uVar21 = (int)local_608 + ((byte)~bVar14 & 1);
      local_608 = (ulong)uVar21;
      if ((int)uVar21 < 0x65 && !bVar14) {
        local_4b8._0_8_ = local_618;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar28 = "Failed";
        if (bVar14) {
          pcVar28 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar28,6);
        pFVar25 = local_5f0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (local_628->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                 m_ptr;
        pMVar22 = (Matrix<float,_4,_3> *)local_328;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_338._0_8_ = pMVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_338._0_8_,
                   CONCAT44(local_338._12_4_,local_338._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  ((string *)&stack0xfffffffffffff9b8,(shaderexecutor *)&local_558,
                   (FloatFormat *)
                   ((long)((local_518.in0.
                            super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar24),pMVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                   local_640);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8) != &local_638) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                          local_638._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_3> *)local_338._0_8_ != (Matrix<float,_4,_3> *)local_328) {
          operator_delete((void *)local_338._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_328._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (local_628->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                 m_ptr;
        pMVar22 = (Matrix<float,_4,_3> *)local_328;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_338._0_8_ = pMVar22;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_338._0_8_,
                   CONCAT44(local_338._12_4_,local_338._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  ((string *)&stack0xfffffffffffff9b8,(shaderexecutor *)&local_558,
                   (FloatFormat *)
                   ((long)((local_518.in1.
                            super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar24),pMVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                   local_640);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8) != &local_638) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                          local_638._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_3> *)local_338._0_8_ != (Matrix<float,_4,_3> *)local_328) {
          operator_delete((void *)local_338._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_328._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (local_628->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_4,_3>_>_>.
                 m_ptr;
        pIVar18 = (IVal *)local_328;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_338._0_8_ = pIVar18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_338._0_8_,
                   CONCAT44(local_338._12_4_,local_338._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,3>>
                  ((string *)&stack0xfffffffffffff9b8,(shaderexecutor *)&local_558,
                   (FloatFormat *)
                   ((long)((local_588.out0.
                            super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_data).m_data[0].m_data +
                   lVar24),(Matrix<float,_4,_3> *)pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                   local_640);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,4,3>>
                  (&local_5e0,(shaderexecutor *)&local_558,(FloatFormat *)local_1a8,pIVar18);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_5e0._M_dataplus._M_p,local_5e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
          operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8) != &local_638) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(uStack_644,in_stack_fffffffffffff9b8),
                          local_638._M_allocated_capacity + 1);
        }
        if ((IVal *)local_338._0_8_ != (IVal *)local_328) {
          operator_delete((void *)local_338._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_328._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
      }
      pMVar22 = (Matrix<float,_4,_3> *)((long)(local_5f8->m_data).m_data[0].m_data + 1);
      pBVar31 = local_628;
      local_5f8 = pMVar22;
    } while (pMVar22 != local_5c0);
  }
  iVar15 = (int)local_608;
  if (100 < iVar15) {
    poVar3 = (ostringstream *)(local_4b8 + 8);
    local_4b8._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar15 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
  }
  poVar3 = (ostringstream *)(local_4b8 + 8);
  if (iVar15 == 0) {
    local_4b8._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4b8._0_8_ = local_618;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x68));
  if (iVar15 == 0) {
    local_4b8._0_8_ = (IVal *)local_4a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"Pass","");
    local_600->m_code = QP_TEST_RESULT_PASS;
    (local_600->m_description)._M_dataplus._M_p = (pointer)&(local_600->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_600->m_description,local_4b8._0_8_,
               (long)&((Vector<tcu::Vector<tcu::Interval,_4>,_3> *)local_4b8._0_8_)->m_data[0].
                      m_data[0].m_hasNaN + CONCAT44(local_4b8._12_4_,local_4b8._8_4_));
    if ((IVal *)local_4b8._0_8_ == (IVal *)local_4a8) goto LAB_009214d8;
    p_Var30 = (_Base_ptr)CONCAT44(local_4a8._4_4_,local_4a8._0_4_);
    pIVar18 = (IVal *)local_4b8._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
    std::ostream::operator<<(local_4b8,iVar15);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
    std::ios_base::~ios_base((ios_base *)(local_4a8 + 0x60));
    local_4b8._0_8_ = (IVal *)local_4a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4b8," test failed. Check log for the details","");
    p_Var30 = (_Base_ptr)
              (CONCAT44(local_4b8._12_4_,local_4b8._8_4_) +
              CONCAT44(local_338._12_4_,local_338._8_4_));
    p_Var29 = (_Base_ptr)0xf;
    if ((IVal *)local_338._0_8_ != (IVal *)local_328) {
      p_Var29 = (_Base_ptr)local_328._0_8_;
    }
    if (p_Var29 < p_Var30) {
      p_Var29 = (_Base_ptr)0xf;
      if ((IVal *)local_4b8._0_8_ != (IVal *)local_4a8) {
        p_Var29 = (_Base_ptr)CONCAT44(local_4a8._4_4_,local_4a8._0_4_);
      }
      if (p_Var29 < p_Var30) goto LAB_0092135c;
      puVar20 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_4b8,0,(char *)0x0,local_338._0_8_);
    }
    else {
LAB_0092135c:
      puVar20 = (undefined8 *)std::__cxx11::string::_M_append(local_338,local_4b8._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar20 + 2);
    if ((double *)*puVar20 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar20 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar20 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar20;
    }
    local_1a8._8_8_ = puVar20[1];
    *puVar20 = pdVar1;
    puVar20[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    local_600->m_code = QP_TEST_RESULT_FAIL;
    (local_600->m_description)._M_dataplus._M_p = (pointer)&(local_600->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_600->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((IVal *)local_4b8._0_8_ != (IVal *)local_4a8) {
      operator_delete((void *)local_4b8._0_8_,CONCAT44(local_4a8._4_4_,local_4a8._0_4_) + 1);
    }
    p_Var30 = (_Base_ptr)local_328._0_8_;
    pIVar18 = (IVal *)local_338._0_8_;
    if ((IVal *)local_338._0_8_ == (IVal *)local_328) goto LAB_009214d8;
  }
  operator_delete(pIVar18,(ulong)((long)&p_Var30->_M_color + 1));
LAB_009214d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_5b8);
  if (local_588.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_588.out0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.out0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.out0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518.in1.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.in1.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.in1.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518.in0.
      super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_518.in0.
                    super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_518.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_518.in0.
                          super__Vector_base<tcu::Matrix<float,_4,_3>,_std::allocator<tcu::Matrix<float,_4,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_600;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}